

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

WordEmbedding *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::CoreMLModels::WordEmbedding>
          (Arena *arena)

{
  WordEmbedding *pWVar1;
  
  if (arena != (Arena *)0x0) {
    pWVar1 = DoCreateMessage<CoreML::Specification::CoreMLModels::WordEmbedding>(arena);
    return pWVar1;
  }
  pWVar1 = (WordEmbedding *)operator_new(0x28);
  CoreML::Specification::CoreMLModels::WordEmbedding::WordEmbedding(pWVar1,(Arena *)0x0,false);
  return pWVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }